

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

void __thiscall QtFontStyle::~QtFontStyle(QtFontStyle *this)

{
  int iVar1;
  QPlatformIntegration *pQVar2;
  undefined4 extraout_var;
  long in_RDI;
  QPlatformIntegration *integration;
  
  while (*(int *)(in_RDI + 4) >> 2 != 0) {
    *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 3 | ((*(int *)(in_RDI + 4) >> 2) + -1) * 4;
    pQVar2 = QGuiApplicationPrivate::platformIntegration();
    if (pQVar2 != (QPlatformIntegration *)0x0) {
      iVar1 = (*pQVar2->_vptr_QPlatformIntegration[0xd])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                ((long *)CONCAT44(extraout_var,iVar1),
                 *(undefined8 *)(*(long *)(in_RDI + 8) + (long)(*(int *)(in_RDI + 4) >> 2) * 0x10));
    }
  }
  free(*(void **)(in_RDI + 8));
  QString::~QString((QString *)0x73f2d3);
  return;
}

Assistant:

QtFontStyle::~QtFontStyle()
{
   while (count) {
       // bitfield count-- in while condition does not work correctly in mwccsym2
       count--;
       QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
       if (integration)
           integration->fontDatabase()->releaseHandle(pixelSizes[count].handle);
   }

   free(pixelSizes);
}